

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

bool __thiscall
kj::_::PromiseAwaiterBase::awaitSuspendImpl(PromiseAwaiterBase *this,CoroutineBase *coroutine)

{
  Event *this_00;
  PromiseNode *pPVar1;
  EventLoop *pEVar2;
  bool bVar3;
  
  pPVar1 = (this->node).ptr;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[2])(pPVar1,&this->node);
  pPVar1 = (this->node).ptr;
  this_00 = &coroutine->super_Event;
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[1])(pPVar1,this_00);
  if (((coroutine->hasSuspendedAtLeastOnce == true) &&
      (pEVar2 = (coroutine->super_Event).loop, pEVar2->running == true)) &&
     (pEVar2->head == this_00)) {
    Event::disarm(this_00);
    bVar3 = false;
  }
  else {
    (coroutine->promiseNodeForTrace).ptr = &this->node;
    coroutine->hasSuspendedAtLeastOnce = true;
    (this->maybeCoroutine).ptr = coroutine;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool PromiseAwaiterBase::awaitSuspendImpl(CoroutineBase& coroutine) {
  node->setSelfPointer(&node);
  node->onReady(&coroutine);

  if (coroutine.canImmediatelyResume()) {
    // The result is immediately ready and this coroutine is running on the event loop's stack, not
    // a user code stack. Let's cancel our event and immediately resume. It's important that we
    // don't perform this optimization if this is the first suspension, because our caller may
    // depend on running code before this promise's continuations fire.
    coroutine.disarm();

    // We can resume ourselves by returning false. This accomplishes the same thing as if we had
    // returned true from await_ready().
    return false;
  } else {
    // Otherwise, we must suspend. Store a reference to the OwnPromiseNode we're waiting on for
    // tracing purposes; await_resume() and/or ~PromiseAwaiterBase() will clear it using the
    // CoroutineBase& reference we save.
    coroutine.setPromiseNodeForTrace(node);
    maybeCoroutine = coroutine;

    return true;
  }
}